

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localizer.cpp
# Opt level: O2

CameraPosition * ary::matrixToPosition(CameraPosition *__return_storage_ptr__,Matx44f *matrix)

{
  size_t sVar1;
  _OutputArray *p_Var2;
  _OutputArray local_a8;
  _InputArray local_90;
  Mat rotation;
  
  CameraPosition::CameraPosition(__return_storage_ptr__);
  cv::Mat::Mat(&rotation,3,3,5);
  *(float *)rotation.data = matrix->val[0];
  *(float *)(rotation.data + 4) = matrix->val[1];
  *(float *)(rotation.data + 8) = matrix->val[2];
  sVar1 = *rotation.step.p;
  *(float *)(rotation.data + sVar1) = matrix->val[4];
  *(float *)(rotation.data + sVar1 + 4) = matrix->val[5];
  *(float *)(rotation.data + sVar1 + 8) = matrix->val[6];
  *(float *)(rotation.data + sVar1 * 2) = matrix->val[8];
  *(float *)(rotation.data + sVar1 * 2 + 4) = matrix->val[9];
  *(float *)(rotation.data + sVar1 * 2 + 8) = matrix->val[10];
  (__return_storage_ptr__->translation).val[0] = matrix->val[3];
  (__return_storage_ptr__->translation).val[1] = matrix->val[7];
  local_90.sz.width = 0;
  local_90.sz.height = 0;
  (__return_storage_ptr__->translation).val[2] = matrix->val[0xb];
  local_90.flags = 0x1010000;
  local_a8.super__InputArray.flags = -0x3dfdfffb;
  local_a8.super__InputArray.sz.width = 1;
  local_a8.super__InputArray.sz.height = 3;
  local_a8.super__InputArray.obj = __return_storage_ptr__;
  local_90.obj = &rotation;
  p_Var2 = (_OutputArray *)cv::noArray();
  cv::Rodrigues(&local_90,&local_a8,p_Var2);
  cv::Mat::~Mat(&rotation);
  return __return_storage_ptr__;
}

Assistant:

CameraPosition matrixToPosition(const Matx44f& matrix) {

    CameraPosition position;

    Mat rotation(3, 3, CV_32FC1);

    rotation.at<float>(0, 0) = matrix(0, 0);
    rotation.at<float>(0, 1) = matrix(0, 1);
    rotation.at<float>(0, 2) = matrix(0, 2);

    rotation.at<float>(1, 0) = matrix(1, 0);
    rotation.at<float>(1, 1) = matrix(1, 1);
    rotation.at<float>(1, 2) = matrix(1, 2);

    rotation.at<float>(2, 0) = matrix(2, 0);
    rotation.at<float>(2, 1) = matrix(2, 1);
    rotation.at<float>(2, 2) = matrix(2, 2);

    position.translation(0) = matrix(0, 3);
    position.translation(1) = matrix(1, 3);
    position.translation(2) = matrix(2, 3);

    cv::Rodrigues(rotation, position.rotation);

    return position;
}